

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>
::val(FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>
      *this)

{
  double dVar1;
  double dVar2;
  
  dVar1 = sin((((this->left_->fadexpr_).expr_)->fadexpr_).expr_.val_);
  dVar2 = sin((this->right_->fadexpr_).expr_.val_);
  return dVar2 * -dVar1;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}